

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * __thiscall FSerializer::Terrain(FSerializer *this,char *key,int *terrain,int *def)

{
  bool bVar1;
  int iVar2;
  FName local_38;
  FName local_34;
  int *piStack_30;
  FName terr;
  int *def_local;
  int *terrain_local;
  char *key_local;
  FSerializer *this_local;
  
  piStack_30 = def;
  bVar1 = isWriting(this);
  if (((!bVar1) || (piStack_30 == (int *)0x0)) || (*terrain != *piStack_30)) {
    P_GetTerrainName((int)&local_34);
    ::Serialize(this,key,&local_34,(FName *)0x0);
    bVar1 = isReading(this);
    if (bVar1) {
      FName::FName(&local_38,&local_34);
      iVar2 = P_FindTerrain(&local_38);
      *terrain = iVar2;
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Terrain(const char *key, int &terrain, int *def)
{
	if (isWriting() && def != nullptr && terrain == *def)
	{
		return *this;
	}
	FName terr = P_GetTerrainName(terrain);
	Serialize(*this, key, terr, nullptr);
	if (isReading())
	{
		terrain = P_FindTerrain(terr);
	}
	return *this;
}